

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O3

void __thiscall
bgui::FileImageWindow::load(FileImageWindow *this,uint *pos,bool down,int w,int h,bool size_max)

{
  uint uVar1;
  pointer pbVar2;
  double dVar3;
  keep kVar4;
  int iVar5;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  Image *pIVar6;
  ImageAdapter<unsigned_char> *this_01;
  Properties *pPVar7;
  keep k;
  undefined1 size_max_00;
  ulong uVar8;
  int flip;
  int rotation;
  Properties prop;
  
  uVar1 = *pos;
  uVar8 = (long)(this->list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar1 < uVar8) {
    this_00 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)operator_new(0x38);
    this_00->depth = 0;
    this_00->width = 0;
    this_00->height = 0;
    this_00->n = 0;
    this_00->pixel = (uchar *)0x0;
    this_00->row = (uchar **)0x0;
    this_00->img = (uchar ***)0x0;
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(this_00,0,0,1);
    pIVar6 = (Image *)gimage::getImageIO();
    gimage::ImageIO::load
              (pIVar6,(char *)this_00,
               (int)(this->list).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[*pos]._M_dataplus._M_p,1,0,0,-1);
    this_01 = (ImageAdapter<unsigned_char> *)operator_new(0xa8);
    ImageAdapter<unsigned_char>::ImageAdapter(this_01,this_00,this->vmin,this->vmax,true);
  }
  else {
    this_01 = (ImageAdapter<unsigned_char> *)0x0;
  }
  if (this->watch_file == true) {
    BaseWindow::removeFileWatch((BaseWindow *)this,this->wid);
    pbVar2 = (this->list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)*pos <
        (ulong)((long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
      iVar5 = BaseWindow::addFileWatch((BaseWindow *)this,pbVar2[*pos]._M_dataplus._M_p);
      this->wid = iVar5;
    }
    else {
      this->watch_file = false;
    }
  }
  if (uVar8 <= uVar1) {
    ImageWindow::setAdapter
              (&this->super_ImageWindow,(ImageAdapterBase *)0x0,false,keep_none,-1,-1,false);
    goto LAB_00115257;
  }
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pPVar7 = (Properties *)gimage::getImageIO();
  gimage::ImageIO::loadProperties(pPVar7,(char *)&prop);
  gutil::Properties::getValue<int>(&prop,"rotation",&rotation,"0");
  gutil::Properties::getValue<int>(&prop,"flip",&flip,"0");
  ImageAdapterBase::setRotationFlip(&this_01->super_ImageAdapterBase,rotation / 0x5a,flip != 0);
  (this_01->super_ImageAdapterBase).scale = this->scale;
  dVar3 = this->imax;
  k = this->kp;
  if (dVar3 <= this->imin || k != keep_all) {
    kVar4 = keep_none;
    if (w < 1 || h < 1) {
      w = -1;
      size_max_00 = false;
      h = -1;
      kVar4 = k;
      size_max = (bool)0;
      if (k != keep_none) goto LAB_0011522b;
    }
LAB_00115206:
    size_max_00 = size_max;
    k = kVar4;
    (this_01->super_ImageAdapterBase).map = this->map;
    (this_01->super_ImageAdapterBase).channel = this->channel;
  }
  else {
    (this_01->super_ImageAdapterBase).imin = this->imin;
    (this_01->super_ImageAdapterBase).imax = dVar3;
    kVar4 = keep_none;
    if (0 < w && 0 < h) goto LAB_00115206;
    w = -1;
    h = -1;
    size_max_00 = false;
  }
LAB_0011522b:
  ImageWindow::setAdapter
            (&this->super_ImageWindow,&this_01->super_ImageAdapterBase,true,k,w,h,(bool)size_max_00)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&prop);
LAB_00115257:
  updateTitle(this);
  return;
}

Assistant:

void FileImageWindow::load(unsigned int &pos, bool down, int w, int h, bool size_max)
{
  ImageAdapterBase *adapt=0;

  // load image and store in adatper

  while (adapt == 0 && pos < list.size())
  {
    gimage::ImageU8    *imageu8=0;

    try
    {
      imageu8=new gimage::ImageU8();
      gimage::getImageIO().load(*imageu8, list[pos].c_str());
      adapt=new ImageAdapter<unsigned char>(imageu8, vmin, vmax, true);
      imageu8=0;
    }
    catch (const gutil::Exception &)
    {
      gimage::ImageU16   *imageu16=0;

      delete imageu8;
      imageu8=0;

      try
      {
        imageu16=new gimage::ImageU16();
        gimage::getImageIO().load(*imageu16, list[pos].c_str());
        adapt=new ImageAdapter<unsigned short>(imageu16, vmin, vmax, true);
        imageu16=0;
      }
      catch (const gutil::Exception &)
      {
        gimage::ImageFloat *imagefloat=0;

        delete imageu16;
        imageu16=0;

        try
        {
          imagefloat=new gimage::ImageFloat();
          gimage::getImageIO().load(*imagefloat, list[pos].c_str());
          adapt=new ImageAdapter<float>(imagefloat, vmin, vmax, true);
          imagefloat=0;
        }
        catch (const gutil::Exception &)
        {
          delete imagefloat;
          imagefloat=0;

          std::cerr << "Cannot load image: " << list[pos] << std::endl;

          if (down)
          {
            list.erase(list.begin()+pos);

            if (pos > 0 && pos >= list.size())
            {
              pos--;
            }
          }
          else
          {
            list.erase(list.begin()+pos);

            if (pos > 0)
            {
              pos--;
            }
          }
        }
      }
    }
  }

  // watch file

  if (watch_file)
  {
    removeFileWatch(wid);

    if (pos < list.size())
    {
      wid=addFileWatch(list[pos].c_str());
    }
    else
    {
      watch_file=false;
    }
  }

  // set image adapter and title

  if (adapt != 0)
  {
    gutil::Properties prop;
    gimage::getImageIO().loadProperties(prop, list[pos].c_str());

    int rotation, flip;
    prop.getValue("rotation", rotation, "0");
    prop.getValue("flip", flip, "0");

    adapt->setRotationFlip(rotation/90, flip != 0);

    adapt->setScale(scale);

    if (imin < imax && kp == keep_all)
    {
      adapt->setMinIntensity(imin);
      adapt->setMaxIntensity(imax);
    }

    if (w > 0 && h > 0)
    {
      adapt->setMapping(map);
      adapt->setChannel(channel);
      setAdapter(adapt, true, keep_none, w, h, size_max);
    }
    else
    {
      if (kp == keep_none)
      {
        adapt->setMapping(map);
        adapt->setChannel(channel);
      }

      setAdapter(adapt, true, kp);
    }
  }
  else
  {
    setAdapter(0);
  }

  updateTitle();
}